

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::AllSameBlocks::findOrAdd
          (AllSameBlocks *this,int32_t index,int32_t count,uint32_t value)

{
  int iVar1;
  int local_28;
  int32_t i;
  uint32_t value_local;
  int32_t count_local;
  int32_t index_local;
  AllSameBlocks *this_local;
  
  if ((this->mostRecent < 0) || (this->values[this->mostRecent] != value)) {
    for (local_28 = 0; local_28 < this->length; local_28 = local_28 + 1) {
      if (this->values[local_28] == value) {
        this->mostRecent = local_28;
        this->refCounts[local_28] = count + this->refCounts[local_28];
        return this->indexes[local_28];
      }
    }
    if (this->length == 0x20) {
      this_local._4_4_ = -2;
    }
    else {
      this->mostRecent = this->length;
      this->indexes[this->length] = index;
      this->values[this->length] = value;
      iVar1 = this->length;
      this->length = iVar1 + 1;
      this->refCounts[iVar1] = count;
      this_local._4_4_ = -1;
    }
  }
  else {
    this->refCounts[this->mostRecent] = count + this->refCounts[this->mostRecent];
    this_local._4_4_ = this->indexes[this->mostRecent];
  }
  return this_local._4_4_;
}

Assistant:

int32_t findOrAdd(int32_t index, int32_t count, uint32_t value) {
        if (mostRecent >= 0 && values[mostRecent] == value) {
            refCounts[mostRecent] += count;
            return indexes[mostRecent];
        }
        for (int32_t i = 0; i < length; ++i) {
            if (values[i] == value) {
                mostRecent = i;
                refCounts[i] += count;
                return indexes[i];
            }
        }
        if (length == CAPACITY) {
            return OVERFLOW;
        }
        mostRecent = length;
        indexes[length] = index;
        values[length] = value;
        refCounts[length++] = count;
        return NEW_UNIQUE;
    }